

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

bool __thiscall
libtorrent::torrent_info::parse_info_section
          (torrent_info *this,bdecode_node *info,error_code *ec,int max_pieces)

{
  shared_array<char> *this_00;
  info_hash_t *this_01;
  pointer *ppbVar1;
  iterator __position;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  type_t tVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  char *p;
  ptrdiff_t pVar11;
  int64_t iVar12;
  ulong uVar13;
  ulong uVar14;
  int i;
  error_code_enum eVar15;
  file_storage *pfVar16;
  long lVar17;
  uint uVar18;
  span<char> error;
  string_view key;
  string_view key_00;
  string_view key_01;
  span<const_char> sVar19;
  span<const_char> sVar20;
  error_code eVar21;
  error_code eVar22;
  string_view sVar23;
  string_view key_02;
  string_view key_03;
  string_view element;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  int local_3c8;
  string name;
  int local_390;
  int local_38c;
  info_hash_t *local_388;
  aux *local_380;
  undefined1 local_378 [48];
  pointer ppcStack_348;
  int local_340;
  bdecode_node collections;
  bdecode_node pieces;
  file_storage v1_files;
  bdecode_node str;
  bdecode_node similar;
  bdecode_node files_node;
  file_storage files;
  bdecode_node file_tree_node;
  
  tVar7 = bdecode_node::type(info);
  if (tVar7 != dict_t) {
    eVar21 = errors::make_error_code(torrent_info_no_dict);
    ec->val_ = eVar21.val_;
    ec->failed_ = eVar21.failed_;
    *(int3 *)&ec->field_0x5 = eVar21._5_3_;
    ec->cat_ = eVar21.cat_;
    return false;
  }
  sVar19 = bdecode_node::data_section(info);
  pcVar10 = sVar19.m_ptr;
  lcrypto::hasher::hasher((hasher *)&v1_files,sVar19);
  lcrypto::hasher::final((sha1_hash *)&files,(hasher *)&v1_files);
  (this->m_info_hash).v1.m_number._M_elems[4] =
       (uint)files.m_files.
             super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
             .
             super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(this->m_info_hash).v1.m_number._M_elems =
       CONCAT44(files.m_num_pieces,files.m_piece_length);
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = files._8_8_;
  lcrypto::hasher::~hasher((hasher *)&v1_files);
  lcrypto::hasher256::hasher256((hasher256 *)&v1_files,sVar19);
  lcrypto::hasher256::final((sha256_hash *)&files,(hasher256 *)&v1_files);
  *(ulong *)((this->m_info_hash).v2.m_number._M_elems + 4) =
       CONCAT44(files.m_files.
                super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                .
                super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                (uint)files.m_files.
                      super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                      .
                      super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  *(pointer *)((this->m_info_hash).v2.m_number._M_elems + 6) =
       files.m_files.
       super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
       super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(ulong *)(this->m_info_hash).v2.m_number._M_elems =
       CONCAT44(files.m_num_pieces,files.m_piece_length);
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 2) = files._8_8_;
  lcrypto::hasher256::~hasher256((hasher256 *)&v1_files);
  sVar20 = bdecode_node::data_section(info);
  if (0x7ffffffe < sVar20.m_len) {
    eVar22 = errors::make_error_code(metadata_too_large);
LAB_003672ae:
    *ec = eVar22;
    return false;
  }
  if (((sVar19.m_len == 0) || (*pcVar10 != 'd')) || (pcVar10[sVar19.m_len + -1] != 'e')) {
    eVar22 = errors::make_error_code(invalid_bencoding);
    goto LAB_003672ae;
  }
  local_380 = (aux *)&(this->m_info_hash).v2;
  this->m_info_section_size = (int)sVar19.m_len;
  this_00 = &this->m_info_section;
  p = (char *)operator_new__((long)(int)sVar19.m_len);
  boost::shared_array<char>::reset<char>(this_00,p);
  memcpy((this->m_info_section).px,pcVar10,(long)this->m_info_section_size);
  pVar11 = bdecode_node::data_offset(info);
  sVar23._M_str = "meta version";
  sVar23._M_len = 0xc;
  iVar12 = bdecode_node::dict_find_int_value(info,sVar23,-1);
  uVar18 = (uint)iVar12;
  if ((int)uVar18 < 1) {
LAB_003672d9:
    *(undefined8 *)(local_380 + 0x10) = 0;
    *(undefined8 *)(local_380 + 0x18) = 0;
    *(undefined8 *)local_380 = 0;
    *(undefined8 *)(local_380 + 8) = 0;
    key._M_str = "piece length";
    key._M_len = 0xc;
    uVar13 = bdecode_node::dict_find_int_value(info,key,-1);
    if (0xffffffffe0003fff < uVar13 - 0x1fffc001) {
      bVar5 = false;
LAB_00367333:
      file_storage::file_storage(&files);
      files.m_piece_length = (int)uVar13;
      key_02._M_str = "name.utf-8";
      key_02._M_len = 10;
      pcVar10 = "name.utf-8";
      bdecode_node::dict_find_string((bdecode_node *)local_378,info,key_02);
      bVar6 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_378);
      if (!bVar6) {
        key_03._M_str = "name";
        key_03._M_len = 4;
        pcVar10 = "name";
        bdecode_node::dict_find_string((bdecode_node *)&v1_files,info,key_03);
        uVar4 = local_378._16_8_;
        uVar3 = local_378._0_8_;
        local_378._0_4_ = v1_files.m_piece_length;
        local_378._4_4_ = v1_files.m_num_pieces;
        local_378._8_8_ = v1_files._8_8_;
        local_378._16_8_ =
             v1_files.m_files.
             super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
             .
             super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
        v1_files.m_piece_length = 0;
        v1_files.m_num_pieces = 0;
        v1_files.m_v2 = false;
        v1_files._9_7_ = 0;
        v1_files.m_files.
        super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
        super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if ((pointer)uVar3 == (pointer)0x0) {
          local_340 = (int)v1_files.m_file_hashes.
                           super_vector<const_char_*,_std::allocator<const_char_*>_>.
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
          local_378._40_8_ =
               v1_files.m_file_hashes.super_vector<const_char_*,_std::allocator<const_char_*>_>.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          ppcStack_348 = v1_files.m_file_hashes.
                         super_vector<const_char_*,_std::allocator<const_char_*>_>.
                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                         super__Vector_impl_data._M_finish;
          local_378._24_8_ =
               v1_files.m_files.
               super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
               .
               super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_378._32_8_ =
               v1_files.m_files.
               super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
               .
               super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          operator_delete((void *)uVar3,uVar4 - uVar3);
          local_378._24_8_ =
               v1_files.m_files.
               super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
               .
               super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_378._32_8_ =
               v1_files.m_files.
               super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
               .
               super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_378._40_8_ =
               v1_files.m_file_hashes.super_vector<const_char_*,_std::allocator<const_char_*>_>.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          ppcStack_348 = v1_files.m_file_hashes.
                         super_vector<const_char_*,_std::allocator<const_char_*>_>.
                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                         super__Vector_impl_data._M_finish;
          local_340 = (int)v1_files.m_file_hashes.
                           super_vector<const_char_*,_std::allocator<const_char_*>_>.
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
          if (v1_files._0_8_ != 0) {
            operator_delete((void *)v1_files._0_8_,
                            (long)v1_files.m_files.
                                  super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                                  .
                                  super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                                  ._M_impl.super__Vector_impl_data._M_start - v1_files._0_8_);
          }
        }
      }
      bVar6 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_378);
      if (!bVar6) {
        boost::system::error_code::operator=(ec,torrent_missing_name);
        (this->m_files).m_piece_length = 0;
        bVar5 = false;
        goto LAB_00367a0a;
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      sVar23 = bdecode_node::string_value((bdecode_node *)local_378);
      element._M_len = sVar23._M_str;
      element._M_str = pcVar10;
      aux::sanitize_append_path_element((aux *)&name,(string *)sVar23._M_len,element);
      this_01 = &this->m_info_hash;
      local_388 = this_01;
      if (name._M_string_length == 0) {
        bVar6 = digest32<160L>::is_all_zeros(&this_01->v1);
        if (bVar6) {
          sVar20.m_len = (difference_type)pcVar10;
          sVar20.m_ptr = (char *)0x20;
          aux::to_hex_abi_cxx11_((string *)&v1_files,local_380,sVar20);
        }
        else {
          sVar19.m_len = (difference_type)pcVar10;
          sVar19.m_ptr = (char *)0x14;
          aux::to_hex_abi_cxx11_((string *)&v1_files,(aux *)this_01,sVar19);
        }
        ::std::__cxx11::string::operator=((string *)&name,(string *)&v1_files);
        if ((vector<aux::file_entry,_file_index_t> *)v1_files._0_8_ != &v1_files.m_files) {
          operator_delete((void *)v1_files._0_8_,
                          (ulong)&(v1_files.m_files.
                                   super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                                   .
                                   super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->field_0x1);
        }
      }
      file_storage::file_storage(&v1_files);
      if (bVar5) {
        file_storage::operator=(&v1_files,&files);
      }
      key_04._M_str = "files";
      key_04._M_len = 5;
      bdecode_node::dict_find_list(&files_node,info,key_04);
      key_05._M_str = "file tree";
      key_05._M_len = 9;
      bdecode_node::dict_find_dict(&file_tree_node,info,key_05);
      bVar6 = bdecode_node::operator_cast_to_bool(&file_tree_node);
      if (bVar5) {
        if (bVar6) {
          pcVar10 = this_00->px;
          bVar6 = bdecode_node::operator_cast_to_bool(&files_node);
          bVar6 = anon_unknown_1::extract_files2
                            (&file_tree_node,&files,&name,pVar11,pcVar10,bVar6,0,ec);
          if (bVar6) {
            file_storage::sanitize_symlinks(&files);
            iVar8 = file_storage::num_files(&files);
            (this->m_flags).m_val = (this->m_flags).m_val & 0xfe | 1 < iVar8;
            bVar6 = bdecode_node::operator_cast_to_bool(&files_node);
            if (!bVar6) {
              key_06._M_str = "length";
              key_06._M_len = 6;
              bdecode_node::dict_find(&pieces,info,key_06);
              bVar6 = bdecode_node::operator_cast_to_bool(&pieces);
              if (pieces.m_tokens.
                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(pieces.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)pieces.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pieces.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (bVar6) goto LAB_0036780a;
              (local_388->v1).m_number._M_elems[0] = 0;
              (local_388->v1).m_number._M_elems[1] = 0;
              (local_388->v1).m_number._M_elems[2] = 0;
              (local_388->v1).m_number._M_elems[3] = 0;
              (local_388->v1).m_number._M_elems[4] = 0;
              goto LAB_003678a2;
            }
LAB_003677bd:
            pfVar16 = &files;
            if (uVar18 == 2) {
              pfVar16 = &v1_files;
            }
            bVar6 = anon_unknown_1::extract_files(&files_node,pfVar16,&name,pVar11,this_00->px,ec);
            if (bVar6) {
              (this->m_flags).m_val = (this->m_flags).m_val | 1;
              goto LAB_003678a2;
            }
          }
LAB_003679a3:
          (this->m_files).m_piece_length = 0;
        }
        else {
          (this->m_files).m_piece_length = 0;
          eVar15 = torrent_missing_file_tree;
LAB_003677a2:
          boost::system::error_code::operator=(ec,eVar15);
        }
        bVar5 = false;
      }
      else {
        if (bVar6) {
          (this->m_files).m_piece_length = 0;
          eVar15 = torrent_missing_meta_version;
          goto LAB_003677a2;
        }
        bVar6 = bdecode_node::operator_cast_to_bool(&files_node);
        if (bVar6) goto LAB_003677bd;
LAB_0036780a:
        ppbVar1 = &pieces.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pieces.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&pieces,"");
        pfVar16 = &files;
        if (uVar18 == 2) {
          pfVar16 = &v1_files;
        }
        bVar6 = anon_unknown_1::extract_single_file
                          (info,pfVar16,(string *)&pieces,pVar11,this_00->px,true,ec);
        if (pieces.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
          operator_delete(pieces.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)&(pieces.m_tokens.
                                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1);
        }
        if (!bVar6) goto LAB_003679a3;
        (this->m_flags).m_val = (this->m_flags).m_val & 0xfe;
LAB_003678a2:
        iVar8 = file_storage::num_files(&files);
        if (iVar8 == 0) {
          eVar15 = no_files_in_torrent;
LAB_0036799e:
          boost::system::error_code::operator=(ec,eVar15);
          goto LAB_003679a3;
        }
        if (files.m_name._M_string_length == 0) {
          eVar15 = torrent_missing_name;
          goto LAB_0036799e;
        }
        if ((bVar5) && (iVar8 = file_storage::num_files(&v1_files), 0 < iVar8)) {
          iVar8 = file_storage::num_files(&files);
          iVar9 = file_storage::num_files(&v1_files);
          if (iVar8 == iVar9 + 1) {
            file_storage::remove_tail_padding(&files);
          }
          bVar6 = aux::files_compatible(&files,&v1_files);
          if (!bVar6) {
            (this->m_files).m_piece_length = 0;
            eVar15 = torrent_inconsistent_files;
            goto LAB_003677a2;
          }
        }
        lVar17 = (long)files.m_piece_length;
        if ((0x3fffffff < files.m_total_size / lVar17) ||
           (files.m_num_pieces = (int)((files.m_total_size + lVar17 + -1) / lVar17),
           0x6666665 < files.m_num_pieces || max_pieces < files.m_num_pieces)) {
          eVar15 = too_many_pieces_in_torrent;
          goto LAB_0036799e;
        }
        key_07._M_str = "pieces";
        key_07._M_len = 6;
        bdecode_node::dict_find_string(&pieces,info,key_07);
        bVar6 = bdecode_node::operator_cast_to_bool(&pieces);
        local_3c8 = (int)pVar11;
        if (bVar6) {
          iVar8 = bdecode_node::string_length(&pieces);
          if (iVar8 != files.m_num_pieces * 0x14) {
            eVar15 = torrent_invalid_hashes;
            goto LAB_00367d8e;
          }
          pVar11 = bdecode_node::string_offset(&pieces);
          this->m_piece_hashes = (int)pVar11 - local_3c8;
LAB_00367abb:
          key_01._M_str = "private";
          key_01._M_len = 7;
          iVar12 = bdecode_node::dict_find_int_value(info,key_01,0);
          (this->m_flags).m_val = (this->m_flags).m_val | (iVar12 != 0) * '\x02';
          key_08._M_str = "similar";
          key_08._M_len = 7;
          bdecode_node::dict_find_list(&similar,info,key_08);
          bVar5 = bdecode_node::operator_cast_to_bool(&similar);
          if (bVar5) {
            for (iVar8 = 0; iVar9 = bdecode_node::list_size(&similar), iVar8 < iVar9;
                iVar8 = iVar8 + 1) {
              bdecode_node::list_at(&collections,&similar,iVar8);
              tVar7 = bdecode_node::type(&collections);
              if (collections.m_tokens.
                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(collections.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)collections.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)collections.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (tVar7 == string_t) {
                bdecode_node::list_at(&collections,&similar,iVar8);
                iVar9 = bdecode_node::string_length(&collections);
                if (collections.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(collections.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)collections.m_tokens.
                                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)collections.m_tokens.
                                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (iVar9 == 0x14) {
                  bdecode_node::list_at(&collections,&similar,iVar8);
                  pVar11 = bdecode_node::string_offset(&collections);
                  str.m_tokens.
                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)pVar11 - local_3c8;
                  __position._M_current =
                       (this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (&this->m_similar_torrents,__position,(int *)&str);
                  }
                  else {
                    *__position._M_current =
                         (int)str.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    (this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_finish = __position._M_current + 1;
                  }
                  if (collections.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(collections.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)collections.m_tokens.
                                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)collections.m_tokens.
                                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
              }
            }
          }
          key_09._M_str = "collections";
          key_09._M_len = 0xb;
          bdecode_node::dict_find_list(&collections,info,key_09);
          bVar5 = bdecode_node::operator_cast_to_bool(&collections);
          if (bVar5) {
            for (iVar8 = 0; iVar9 = bdecode_node::list_size(&collections), iVar8 < iVar9;
                iVar8 = iVar8 + 1) {
              bdecode_node::list_at(&str,&collections,iVar8);
              tVar7 = bdecode_node::type(&str);
              if (tVar7 == string_t) {
                pVar11 = bdecode_node::string_offset(&str);
                local_38c = (int)pVar11 - local_3c8;
                local_390 = bdecode_node::string_length(&str);
                ::std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                emplace_back<int,int>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           &this->m_collections,&local_38c,&local_390);
              }
              pvVar2 = (void *)CONCAT44(str.m_tokens.
                                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        (int)str.m_tokens.
                                             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
              if (pvVar2 != (void *)0x0) {
                operator_delete(pvVar2,(long)str.m_tokens.
                                             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                       (long)pvVar2);
              }
            }
          }
          key_10._M_str = "ssl-cert";
          key_10._M_len = 8;
          bdecode_node::dict_find_string(&str,info,key_10);
          bVar5 = bdecode_node::operator_cast_to_bool(&str);
          pvVar2 = (void *)CONCAT44(str.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)str.m_tokens.
                                         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,(long)str.m_tokens.
                                         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pvVar2);
          }
          if (bVar5) {
            (this->m_flags).m_val = (this->m_flags).m_val | 8;
          }
          bVar5 = files.m_total_size != 0;
          if (files.m_total_size == 0) {
            boost::system::error_code::operator=(ec,torrent_invalid_length);
            (this->m_files).m_piece_length = 0;
          }
          else {
            file_storage::swap(&this->m_files,&files);
          }
          if (collections.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(collections.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)collections.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)collections.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (similar.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(similar.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)similar.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)similar.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          if (bVar5) goto LAB_00367abb;
          eVar15 = torrent_missing_pieces;
LAB_00367d8e:
          boost::system::error_code::operator=(ec,eVar15);
          (this->m_files).m_piece_length = 0;
          bVar5 = false;
        }
        if (pieces.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(pieces.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)pieces.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)pieces.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (file_tree_node.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(file_tree_node.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)file_tree_node.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)file_tree_node.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (files_node.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(files_node.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)files_node.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)files_node.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      file_storage::~file_storage(&v1_files);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,
                        CONCAT71(name.field_2._M_allocated_capacity._1_7_,
                                 name.field_2._M_local_buf[0]) + 1);
      }
LAB_00367a0a:
      if ((pointer)local_378._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_378._0_8_,local_378._16_8_ - local_378._0_8_);
      }
      file_storage::~file_storage(&files);
      return bVar5;
    }
  }
  else {
    error.m_len = 200;
    error.m_ptr = (char *)&files;
    bVar5 = bdecode_node::has_soft_error(info,error);
    eVar15 = invalid_bencoding;
    if ((bVar5) || (eVar15 = torrent_unknown_version, 2 < uVar18)) goto LAB_0036731f;
    if (uVar18 == 1) goto LAB_003672d9;
    key_00._M_str = "piece length";
    key_00._M_len = 0xc;
    uVar13 = bdecode_node::dict_find_int_value(info,key_00,-1);
    if (((0xffffffffe0003fff < uVar13 - 0x1fffc001) && (0x3fff < uVar13)) &&
       (uVar14 = uVar13 - (uVar13 >> 1 & 0x5555555555555555),
       uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333),
       (byte)(((uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) < 2)) {
      bVar5 = true;
      goto LAB_00367333;
    }
  }
  eVar15 = torrent_missing_piece_length;
LAB_0036731f:
  boost::system::error_code::operator=(ec,eVar15);
  return false;
}

Assistant:

bool torrent_info::parse_info_section(bdecode_node const& info
		, error_code& ec, int const max_pieces)
	{
		if (info.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_info_no_dict;
			return false;
		}

		// hash the info-field to calculate info-hash
		auto section = info.data_section();
		m_info_hash.v1 = hasher(section).final();
		m_info_hash.v2 = hasher256(section).final();
		if (info.data_section().size() >= std::numeric_limits<int>::max())
		{
			ec = errors::metadata_too_large;
			return false;
		}

		if (section.empty() || section[0] != 'd' || section[section.size() - 1] != 'e')
		{
			ec = errors::invalid_bencoding;
			return false;
		}

		// copy the info section
		m_info_section_size = int(section.size());
		m_info_section.reset(new char[aux::numeric_cast<std::size_t>(m_info_section_size)]);
		std::memcpy(m_info_section.get(), section.data(), aux::numeric_cast<std::size_t>(m_info_section_size));

		// this is the offset from the start of the torrent file buffer to the
		// info-dictionary (within the torrent file).
		// we need this because we copy just the info dictionary buffer and pull
		// out parsed data (strings) from the bdecode_node and need to make them
		// point into our copy of the buffer.
		std::ptrdiff_t const info_offset = info.data_offset();

		// check for a version key
		int const version = int(info.dict_find_int_value("meta version", -1));
		if (version > 0)
		{
			char error_string[200];
			if (info.has_soft_error(error_string))
			{
				ec = errors::invalid_bencoding;
				return false;
			}

			if (version > 2)
			{
				ec = errors::torrent_unknown_version;
				return false;
			}
		}

		if (version < 2)
		{
			// this is a v1 torrent so the v2 info hash has no meaning
			// clear it just to make sure no one tries to use it
			m_info_hash.v2.clear();
		}

		// extract piece length
		std::int64_t const piece_length = info.dict_find_int_value("piece length", -1);
		if (piece_length <= 0 || piece_length > file_storage::max_piece_size)
		{
			ec = errors::torrent_missing_piece_length;
			return false;
		}

		// according to BEP 52: "It must be a power of two and at least 16KiB."
		if (version > 1 && (piece_length < default_block_size
			|| (piece_length & (piece_length - 1)) != 0))
		{
			ec = errors::torrent_missing_piece_length;
			return false;
		}

		file_storage files;
		files.set_piece_length(static_cast<int>(piece_length));

		// extract file name (or the directory name if it's a multi file libtorrent)
		bdecode_node name_ent = info.dict_find_string("name.utf-8");
		if (!name_ent) name_ent = info.dict_find_string("name");
		if (!name_ent)
		{
			ec = errors::torrent_missing_name;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		std::string name;
		aux::sanitize_append_path_element(name, name_ent.string_value());
		if (name.empty())
		{
			if (m_info_hash.has_v1())
				name = aux::to_hex(m_info_hash.v1);
			else
				name = aux::to_hex(m_info_hash.v2);
		}

		// extract file list

		// save a copy so that we can extract both v1 and v2 files then compare the results
		file_storage v1_files;
		if (version >= 2)
			v1_files = files;

		bdecode_node const files_node = info.dict_find_list("files");

		bdecode_node file_tree_node = info.dict_find_dict("file tree");
		if (version >= 2 && file_tree_node)
		{
			if (!extract_files2(file_tree_node, files, name, info_offset
				, m_info_section.get(), bool(files_node), 0, ec))
			{
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}

			files.sanitize_symlinks();
			if (files.num_files() > 1)
				m_flags |= multifile;
			else
				m_flags &= ~multifile;
		}
		else if (version >= 2)
		{
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			ec = errors::torrent_missing_file_tree;
			return false;
		}
		else if (file_tree_node)
		{
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			ec = errors::torrent_missing_meta_version;
			return false;
		}

		if (!files_node)
		{
			// if this is a v2 torrent it is ok for the length key to be missing
			// that means it is a v2 only torrent
			if (version < 2 || info.dict_find("length"))
			{
				// if there's no list of files, there has to be a length
				// field.
				if (!extract_single_file(info, version == 2 ? v1_files : files, ""
					, info_offset, m_info_section.get(), true, ec))
				{
					// mark the torrent as invalid
					m_files.set_piece_length(0);
					return false;
				}

				m_flags &= ~multifile;
			}
			else
			{
				// this is a v2 only torrent so clear the v1 info hash to make sure no one uses it
				m_info_hash.v1.clear();
			}
		}
		else
		{
			if (!extract_files(files_node, version == 2 ? v1_files : files, name
				, info_offset, m_info_section.get(), ec))
			{
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}
			m_flags |= multifile;
		}
		if (files.num_files() == 0)
		{
			ec = errors::no_files_in_torrent;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}
		if (files.name().empty())
		{
			ec = errors::torrent_missing_name;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		// ensure hybrid torrents have compatible v1 and v2 file storages
		if (version >= 2 && v1_files.num_files() > 0)
		{
			// previous versions of libtorrent did not not create hybrid
			// torrents with "tail-padding". When loading, accept both.
			if (files.num_files() == v1_files.num_files() + 1)
			{
				files.remove_tail_padding();
			}

			if (!aux::files_compatible(files, v1_files))
			{
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				ec = errors::torrent_inconsistent_files;
				return false;
			}
		}

		// extract SHA-1 hashes for all pieces
		// we want this division to round upwards, that's why we have the
		// extra addition

		if (files.total_size() / files.piece_length() > file_storage::max_num_pieces)
		{
			ec = errors::too_many_pieces_in_torrent;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		files.set_num_pieces(int((files.total_size() + files.piece_length() - 1)
			/ files.piece_length()));

		// we expect the piece hashes to be < 2 GB in size
		if (files.num_pieces() >= std::numeric_limits<int>::max() / 20
			|| files.num_pieces() > max_pieces)
		{
			ec = errors::too_many_pieces_in_torrent;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		bdecode_node const pieces = info.dict_find_string("pieces");
		if (!pieces)
		{
			if (version < 2)
			{
				ec = errors::torrent_missing_pieces;
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}
		}
		else
		{
			if (pieces.string_length() != files.num_pieces() * 20)
			{
				ec = errors::torrent_invalid_hashes;
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}

			std::ptrdiff_t const hash_offset = pieces.string_offset() - info_offset;
			TORRENT_ASSERT(hash_offset < std::numeric_limits<std::int32_t>::max());
			TORRENT_ASSERT(hash_offset >= 0);
			m_piece_hashes = static_cast<std::int32_t>(hash_offset);
			TORRENT_ASSERT(m_piece_hashes > 0);
			TORRENT_ASSERT(m_piece_hashes < m_info_section_size);
		}

		m_flags |= (info.dict_find_int_value("private", 0) != 0)
			? private_torrent : torrent_info_flags_t{};

#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		bdecode_node const similar = info.dict_find_list("similar");
		if (similar)
		{
			for (int i = 0; i < similar.list_size(); ++i)
			{
				if (similar.list_at(i).type() != bdecode_node::string_t)
					continue;

				if (similar.list_at(i).string_length() != 20)
					continue;
				m_similar_torrents.push_back(static_cast<std::int32_t>(
					similar.list_at(i).string_offset() - info_offset));
			}
		}

		bdecode_node const collections = info.dict_find_list("collections");
		if (collections)
		{
			for (int i = 0; i < collections.list_size(); ++i)
			{
				bdecode_node const str = collections.list_at(i);

				if (str.type() != bdecode_node::string_t) continue;

				m_collections.emplace_back(
					aux::numeric_cast<std::int32_t>(str.string_offset() - info_offset)
					, str.string_length());
			}
		}
#endif // TORRENT_DISABLE_MUTABLE_TORRENTS

		if (info.dict_find_string("ssl-cert"))
			m_flags |= ssl_torrent;

		if (files.total_size() == 0)
		{
			ec = errors::torrent_invalid_length;
			// mark the torrent as invalid
			m_files.set_piece_length(0);
			return false;
		}

		// now, commit the files structure we just parsed out
		// into the torrent_info object.
		m_files.swap(files);

		TORRENT_ASSERT(m_info_hash.has_v2() == m_files.v2());
		return true;
	}